

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profit.c
# Opt level: O1

bool_t prf_openflight_check_file(char *filename)

{
  uint uVar1;
  FILE *__stream;
  size_t sVar2;
  char magic [2];
  char local_1a;
  char local_19;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0;
  }
  else {
    sVar2 = fread(&local_1a,1,2,__stream);
    fclose(__stream);
    uVar1 = (uint)(local_19 == '\x01' && (local_1a == '\0' && (int)sVar2 == 2));
  }
  return uVar1;
}

Assistant:

bool_t
prf_openflight_check_file(
    const char * filename )
{
    FILE * fp;
    char magic[2];
    int tmp;
    if ( (fp = fopen( filename, "rb" )) == NULL ) return FALSE;
    tmp = fread( magic, 1, 2, fp );
    fclose( fp );
    if ( tmp != 2 || magic[0] != 0 || magic[1] != 1 ) return FALSE;
    return TRUE;
}